

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall
TypedImageChannel<unsigned_int>::resize(TypedImageChannel<unsigned_int> *this,int width,int height)

{
  Imf_3_2::Array2D<unsigned_int>::resizeEraseUnsafe(&this->_pixels,(long)height,(long)width);
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}